

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O0

void walk_recursive(char *current_dir_string,GDir *current_dir,GTree *current_tree,
                   gboolean follow_symlinks,GSList **errors)

{
  int iVar1;
  GDir *current_dir_00;
  undefined8 uVar2;
  GTree *current_tree_00;
  filename_representations *pfVar3;
  filename_representations *fr_1;
  GDir *sub_dir;
  GTree *sub_dir_tree;
  GError *err;
  filename_representations *fr;
  gchar *filename;
  gchar *basename;
  GSList **errors_local;
  GTree *pGStack_20;
  gboolean follow_symlinks_local;
  GTree *current_tree_local;
  GDir *current_dir_local;
  char *current_dir_string_local;
  
  basename = (gchar *)errors;
  errors_local._4_4_ = follow_symlinks;
  pGStack_20 = current_tree;
  current_tree_local = (GTree *)current_dir;
  current_dir_local = (GDir *)current_dir_string;
  while (filename = (gchar *)g_dir_read_name(current_tree_local), filename != (gchar *)0x0) {
    fr = (filename_representations *)g_build_filename(current_dir_local,filename,0);
    iVar1 = g_file_test(fr,4);
    if (iVar1 == 0) {
      iVar1 = g_file_test(fr,1);
      if (iVar1 != 0) {
        pfVar3 = filename_representations_new((char *)fr,2);
        g_tree_insert(pGStack_20,pfVar3,0);
      }
    }
    else {
      err = (GError *)0x0;
      sub_dir_tree = (GTree *)0x0;
      if ((errors_local._4_4_ != 0) || (iVar1 = g_file_test(fr,2), iVar1 == 0)) {
        current_dir_00 = (GDir *)g_dir_open(fr,0,&sub_dir_tree);
        if (sub_dir_tree == (GTree *)0x0) {
          err = (GError *)filename_representations_new((char *)fr,1);
          current_tree_00 =
               (GTree *)g_tree_new_full(compare_filenames,0,filename_representations_free,
                                        filetree_destroy);
          g_tree_insert(pGStack_20,err,current_tree_00);
          walk_recursive((char *)fr,current_dir_00,current_tree_00,errors_local._4_4_,
                         (GSList **)basename);
          g_dir_close(current_dir_00);
        }
        else {
          uVar2 = g_slist_prepend(*(undefined8 *)basename,sub_dir_tree);
          *(undefined8 *)basename = uVar2;
        }
      }
    }
    g_free(fr);
  }
  return;
}

Assistant:

static void walk_recursive(const char *current_dir_string,
                           GDir *current_dir,
                           GTree *current_tree,
                           gboolean follow_symlinks,
                           GSList **errors)
{
    const gchar *basename;
    gchar *filename;

    while ((basename = g_dir_read_name(current_dir))) {
        filename = g_build_filename(current_dir_string, basename, NULL);
        if (g_file_test(filename, G_FILE_TEST_IS_DIR)) {
            struct filename_representations *fr = NULL;
            GError *err = NULL;
            GTree *sub_dir_tree = NULL;
            GDir *sub_dir;

            if (!follow_symlinks
                && g_file_test(filename, G_FILE_TEST_IS_SYMLINK)) {
                goto next;
            }

            sub_dir = g_dir_open(filename, 0, &err);
            if (err) {
                *errors = g_slist_prepend(*errors, err);
                goto next;
            }
            fr = filename_representations_new(filename, FILETREE_DIR);
            sub_dir_tree = g_tree_new_full(compare_filenames, NULL,
                                           filename_representations_free,
                                           filetree_destroy);
            g_tree_insert(current_tree, fr, sub_dir_tree);
            walk_recursive(filename, sub_dir, sub_dir_tree,
                           follow_symlinks, errors);
            g_dir_close(sub_dir);
        } else if (g_file_test(filename, G_FILE_TEST_IS_REGULAR)) {
            struct filename_representations *fr;
            fr = filename_representations_new(filename, FILETREE_FILE);
            g_tree_insert(current_tree, fr, NULL);
        }
      next:
        g_free(filename);
    }
}